

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

uint128 absl::anon_unknown_0::MakeU128(int64_t a)

{
  uint128 local_38;
  unsigned_long local_20;
  int64_t a_local;
  uint128 u128;
  
  local_20 = a;
  memset(&a_local,0,0x10);
  if ((long)local_20 < 0) {
    uint128::operator++((uint128 *)&a_local);
    local_20 = -(local_20 + 1);
  }
  uint128::uint128(&local_38,local_20);
  uint128::operator+=((uint128 *)&a_local,local_38);
  return _a_local;
}

Assistant:

inline uint128 MakeU128(int64_t a) {
  uint128 u128 = 0;
  if (a < 0) {
    ++u128;
    ++a;  // Makes it safe to negate 'a'
    a = -a;
  }
  u128 += static_cast<uint64_t>(a);
  return u128;
}